

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestmassQuoteParseGetString::RunImpl(TestmassQuoteParseGetString *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  allocator<char> local_259;
  TestDetails local_258;
  FieldBase local_238;
  NoQuoteSets group;
  MassQuote object;
  
  FIX42::MassQuote::MassQuote(&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"1",(allocator<char> *)&local_258);
  FIX::QuoteID::QuoteID((QuoteID *)&group,(STRING *)&local_238);
  FIX42::MassQuote::set(&object,(QuoteID *)&group);
  FIX::FieldBase::~FieldBase((FieldBase *)&group);
  std::__cxx11::string::~string((string *)&local_238);
  FIX42::MassQuote::NoQuoteSets::NoQuoteSets(&group);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"A",&local_259);
  FIX::QuoteSetID::QuoteSetID((QuoteSetID *)&local_238,(STRING *)&local_258);
  FIX42::MassQuote::NoQuoteSets::set(&group,(QuoteSetID *)&local_238);
  FIX::FieldBase::~FieldBase(&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"DELL",&local_259);
  FIX::UnderlyingSymbol::UnderlyingSymbol((UnderlyingSymbol *)&local_238,(STRING *)&local_258);
  FIX42::MassQuote::NoQuoteSets::set(&group,(UnderlyingSymbol *)&local_238);
  FIX::FieldBase::~FieldBase(&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  local_258.suiteName._0_4_ = 10;
  FIX::EncodedUnderlyingSecurityDescLen::EncodedUnderlyingSecurityDescLen
            ((EncodedUnderlyingSecurityDescLen *)&local_238,(LENGTH *)&local_258);
  FIX42::MassQuote::NoQuoteSets::set(&group,(EncodedUnderlyingSecurityDescLen *)&local_238);
  FIX::FieldBase::~FieldBase(&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"DELL\x01COMP\x01",&local_259);
  FIX::EncodedUnderlyingSecurityDesc::EncodedUnderlyingSecurityDesc
            ((EncodedUnderlyingSecurityDesc *)&local_238,(DATA *)&local_258);
  FIX42::MassQuote::NoQuoteSets::set(&group,(EncodedUnderlyingSecurityDesc *)&local_238);
  FIX::FieldBase::~FieldBase(&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  FIX::Message::addGroup((Message *)&object,&group.super_Group);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  FIX::Message::toString_abi_cxx11_((int)&local_238,(int)&object,8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_258,*ppTVar2,0x4a5);
  UnitTest::CheckEqual<char[77],std::__cxx11::string>
            (results,(char (*) [77])
                     "8=FIX.4.2\x019=54\x0135=i\x01117=1\x01296=1\x01302=A\x01311=DELL\x01364=10\x01365=DELL\x01COMP\x01\x0110=152\x01"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
             &local_258);
  std::__cxx11::string::~string((string *)&local_238);
  FIX::FieldMap::~FieldMap((FieldMap *)&group);
  FIX::Message::~Message((Message *)&object);
  return;
}

Assistant:

TEST(massQuoteParseGetString)
{
  MassQuote object;

  object.set( QuoteID( "1" ) );

  MassQuote::NoQuoteSets group;
  group.set( QuoteSetID( "A" ) );
  group.set( UnderlyingSymbol( "DELL" ) );
  group.set( EncodedUnderlyingSecurityDescLen( 10 ) );
  group.set( EncodedUnderlyingSecurityDesc( "DELL\001COMP\001" ) );
  object.addGroup( group );

  CHECK_EQUAL(
          ( "8=FIX.4.2\0019=54\00135=i\001117=1\001296=1\001302=A\001"
            "311=DELL\001364=10\001365=DELL\001COMP\001\00110=152\001" ), object.toString() );
}